

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  int iVar1;
  xmlBufPtr buf_00;
  xmlChar *pxVar2;
  xmlEntityPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlNodePtr pxVar5;
  bool bVar6;
  xmlChar local_82 [2];
  int len;
  xmlChar buffer [10];
  xmlNodePtr temp;
  xmlChar tmp;
  int charval;
  xmlBufPtr buf;
  xmlEntityPtr ent;
  xmlChar *q;
  xmlChar *cur;
  xmlChar *val;
  xmlNodePtr node;
  xmlNodePtr last;
  xmlNodePtr head;
  xmlNodePtr ret;
  xmlChar *value_local;
  xmlDoc *doc_local;
  
  head = (xmlNodePtr)0x0;
  last = (xmlNodePtr)0x0;
  node = (xmlNodePtr)0x0;
  if (value == (xmlChar *)0x0) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    buf_00 = xmlBufCreateSize(0);
    if (buf_00 == (xmlBufPtr)0x0) {
      doc_local = (xmlDoc *)0x0;
    }
    else {
      xmlBufSetAllocationScheme(buf_00,XML_BUFFER_ALLOC_DOUBLEIT);
      ent = (xmlEntityPtr)value;
      q = value;
      do {
        do {
          while( true ) {
            cur = (xmlChar *)0x0;
            if (*q == '\0') {
              if (((xmlEntityPtr)q != ent) || (last == (xmlNodePtr)0x0)) {
                xmlBufAdd(buf_00,(xmlChar *)ent,(int)q - (int)ent);
              }
              iVar1 = xmlBufIsEmpty(buf_00);
              pxVar4 = last;
              if (iVar1 == 0) {
                pxVar4 = xmlNewDocText(doc,(xmlChar *)0x0);
                if (pxVar4 == (xmlNodePtr)0x0) goto LAB_001ba088;
                pxVar2 = xmlBufDetach(buf_00);
                pxVar4->content = pxVar2;
                if (node != (xmlNodePtr)0x0) {
                  xmlAddNextSibling(node,pxVar4);
                  pxVar4 = last;
                }
              }
              last = pxVar4;
              head = last;
              last = (xmlNodePtr)0x0;
              goto LAB_001ba088;
            }
            if (*q == '&') break;
            q = q + 1;
          }
          temp._4_4_ = 0;
          if (((xmlEntityPtr)q != ent) &&
             (iVar1 = xmlBufAdd(buf_00,(xmlChar *)ent,(int)q - (int)ent), iVar1 != 0))
          goto LAB_001ba088;
          if ((q[1] == '#') && (q[2] == 'x')) {
            q = q + 3;
            temp._3_1_ = *q;
            while (temp._3_1_ != 0x3b) {
              if ((temp._3_1_ < 0x30) || (0x39 < temp._3_1_)) {
                if ((temp._3_1_ < 0x61) || (0x66 < temp._3_1_)) {
                  if ((temp._3_1_ < 0x41) || (0x46 < temp._3_1_)) {
                    xmlTreeErr(0x514,(xmlNodePtr)doc,(char *)0x0);
                    temp._4_4_ = 0;
                    break;
                  }
                  temp._4_4_ = temp._4_4_ * 0x10 + (uint)temp._3_1_ + -0x37;
                }
                else {
                  temp._4_4_ = temp._4_4_ * 0x10 + (uint)temp._3_1_ + -0x57;
                }
              }
              else {
                temp._4_4_ = temp._4_4_ * 0x10 + (temp._3_1_ - 0x30);
              }
              q = q + 1;
              temp._3_1_ = *q;
            }
            if (temp._3_1_ == 0x3b) {
              q = q + 1;
            }
          }
          else if (q[1] == '#') {
            q = q + 2;
            temp._3_1_ = *q;
            while (temp._3_1_ != 0x3b) {
              if ((temp._3_1_ < 0x30) || (0x39 < temp._3_1_)) {
                xmlTreeErr(0x515,(xmlNodePtr)doc,(char *)0x0);
                temp._4_4_ = 0;
                break;
              }
              temp._4_4_ = temp._4_4_ * 10 + (temp._3_1_ - 0x30);
              q = q + 1;
              temp._3_1_ = *q;
            }
            if (temp._3_1_ == 0x3b) {
              q = q + 1;
            }
          }
          else {
            pxVar2 = q + 1;
            q = pxVar2;
            while( true ) {
              bVar6 = false;
              if (*q != '\0') {
                bVar6 = *q != ';';
              }
              if (!bVar6) break;
              q = q + 1;
            }
            if (*q == '\0') {
              xmlTreeErr(0x516,(xmlNodePtr)doc,(char *)pxVar2);
              goto LAB_001ba088;
            }
            if (q != pxVar2) {
              cur = xmlStrndup(pxVar2,(int)q - (int)pxVar2);
              pxVar3 = xmlGetDocEntity(doc,cur);
              if ((pxVar3 == (xmlEntityPtr)0x0) || (pxVar3->etype != XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar1 = xmlBufIsEmpty(buf_00);
                pxVar4 = node;
                pxVar5 = last;
                if (iVar1 == 0) {
                  pxVar4 = xmlNewDocText(doc,(xmlChar *)0x0);
                  if (pxVar4 == (xmlNodePtr)0x0) goto LAB_001ba088;
                  pxVar2 = xmlBufDetach(buf_00);
                  pxVar4->content = pxVar2;
                  pxVar5 = pxVar4;
                  if (node != (xmlNodePtr)0x0) {
                    pxVar4 = xmlAddNextSibling(node,pxVar4);
                    pxVar5 = last;
                  }
                }
                last = pxVar5;
                node = pxVar4;
                pxVar4 = xmlNewReference(doc,cur);
                if (pxVar4 == (xmlNodePtr)0x0) goto LAB_001ba088;
                if ((pxVar3 != (xmlEntityPtr)0x0) && (pxVar3->children == (_xmlNode *)0x0)) {
                  pxVar3->children = (_xmlNode *)0xffffffffffffffff;
                  pxVar5 = xmlStringGetNodeList(doc,pxVar4->content);
                  pxVar3->children = pxVar5;
                  pxVar3->owner = 1;
                  for (buffer._2_8_ = pxVar3->children; buffer._2_8_ != 0;
                      buffer._2_8_ = *(undefined8 *)(buffer._2_8_ + 0x30)) {
                    *(xmlEntityPtr *)(buffer._2_8_ + 0x28) = pxVar3;
                    pxVar3->last = (_xmlNode *)buffer._2_8_;
                  }
                }
                pxVar5 = pxVar4;
                if (node != (xmlNodePtr)0x0) {
                  pxVar4 = xmlAddNextSibling(node,pxVar4);
                  pxVar5 = last;
                }
              }
              else {
                iVar1 = xmlBufCat(buf_00,pxVar3->content);
                pxVar4 = node;
                pxVar5 = last;
                if (iVar1 != 0) goto LAB_001ba088;
              }
              last = pxVar5;
              node = pxVar4;
              (*xmlFree)(cur);
            }
            q = q + 1;
          }
          cur = (xmlChar *)0x0;
          ent = (xmlEntityPtr)q;
        } while (temp._4_4_ == 0);
        iVar1 = xmlCopyCharMultiByte(local_82,temp._4_4_);
        local_82[iVar1] = '\0';
        iVar1 = xmlBufCat(buf_00,local_82);
      } while (iVar1 == 0);
LAB_001ba088:
      xmlBufFree(buf_00);
      if (cur != (xmlChar *)0x0) {
        (*xmlFree)(cur);
      }
      if (last != (xmlNodePtr)0x0) {
        xmlFreeNodeList(last);
      }
      doc_local = (xmlDoc *)head;
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
                            if (node == NULL)
                                goto out;
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = head = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL)
			    goto out;
			if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = head = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (head == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL)
            goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

    ret = head;
    head = NULL;

out:
    xmlBufFree(buf);
    if (val != NULL) xmlFree(val);
    if (head != NULL) xmlFreeNodeList(head);
    return(ret);
}